

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O1

void __thiscall helics::Publication::publish(Publication *this,double val,string *units)

{
  size_t __n;
  pointer pcVar1;
  int iVar2;
  uint64_t match_flags;
  InvalidConversion *this_00;
  string_view message;
  precise_unit punit;
  precise_unit local_48;
  string local_38;
  
  __n = units->_M_string_length;
  if (__n == (this->pubUnits)._M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((units->_M_dataplus)._M_p,(this->pubUnits)._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_0020adbe;
    }
    publish(this,val);
  }
LAB_0020adbe:
  pcVar1 = (units->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + units->_M_string_length);
  match_flags = ::units::getDefaultFlags();
  local_48 = ::units::unit_from_string(&local_38,match_flags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((NAN(local_48.multiplier_)) && (local_48.base_units_ == (unit_data)0xfa94a488)) {
    this_00 = (InvalidConversion *)__cxa_allocate_exception(0x28);
    message._M_str = "unable to perform the requested conversion";
    message._M_len = 0x2a;
    InvalidConversion::InvalidConversion(this_00,message);
    __cxa_throw(this_00,&InvalidConversion::typeinfo,HelicsException::~HelicsException);
  }
  publish(this,val,&local_48);
  return;
}

Assistant:

void Publication::publish(double val, const std::string& units)
{
    if (units == pubUnits) {
        publish(val);
    }
    auto punit = units::unit_from_string(units);
    if (units::is_valid(punit)) {
        publish(val, punit);
    } else {
        throw(InvalidConversion{});
    }
}